

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

void __thiscall
so_5::disp::prio_dedicated_threads::one_per_prio::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::disp_data_source_t::set_data_sources_name_base(disp_data_source_t *this,string *name_base)

{
  string local_60;
  prefix_t local_40;
  
  std::__cxx11::string::string((string *)&local_60,(string *)name_base);
  reuse::make_disp_prefix(&local_40,"pdt-opp",&local_60,this->m_dispatcher);
  *(undefined8 *)((this->m_base_prefix).m_value + 0x10) = local_40.m_value._16_8_;
  *(undefined8 *)((this->m_base_prefix).m_value + 0x18) = local_40.m_value._24_8_;
  *(undefined8 *)((this->m_base_prefix).m_value + 0x20) = local_40.m_value._32_8_;
  *(undefined8 *)((this->m_base_prefix).m_value + 0x28) = local_40.m_value._40_8_;
  *(undefined8 *)(this->m_base_prefix).m_value = local_40.m_value._0_8_;
  *(undefined8 *)((this->m_base_prefix).m_value + 8) = local_40.m_value._8_8_;
  *(undefined8 *)((this->m_base_prefix).m_value + 0x10) = local_40.m_value._16_8_;
  *(undefined8 *)((this->m_base_prefix).m_value + 0x18) = local_40.m_value._24_8_;
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void
				set_data_sources_name_base(
					const std::string & name_base )
					{
						using namespace so_5::disp::reuse;

						m_base_prefix = make_disp_prefix(
								"pdt-opp",
								name_base,
								&m_dispatcher );
					}